

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O2

hash_entry_t * hash_detach_entry(adh_node_t *node)

{
  hash_entry_t *phVar1;
  hash_entry *phVar2;
  hash_entry_t **pphVar3;
  hash_entry **pphVar4;
  
  pphVar3 = map_weight_nodes.buckets + (ulong)node->weight % 0x1eef;
  while( true ) {
    phVar1 = *pphVar3;
    if (phVar1 == (hash_entry_t *)0x0) {
      return phVar1;
    }
    if (phVar1->value == node) break;
    pphVar3 = &phVar1->next;
  }
  phVar2 = phVar1->next;
  pphVar4 = &phVar1->prev->next;
  if (phVar1->prev == (hash_entry *)0x0) {
    pphVar4 = map_weight_nodes.buckets + (ulong)node->weight % 0x1eef;
  }
  *pphVar4 = phVar2;
  if (phVar2 != (hash_entry *)0x0) {
    phVar2->prev = phVar1->prev;
  }
  phVar1->next = (hash_entry *)0x0;
  phVar1->prev = (hash_entry *)0x0;
  return phVar1;
}

Assistant:

hash_entry_t* hash_detach_entry(adh_node_t *node) {
    int hash_index = hash_get_index(node->weight);

    hash_entry_t  *entry = map_weight_nodes.buckets[hash_index];
    while(entry) {
        if(entry->value == node) {
            if(entry->prev == NULL) {
                map_weight_nodes.buckets[hash_index] = entry->next;
            }
            else {
                entry->prev->next = entry->next;
            }

            if(entry->next)
                entry->next->prev = entry->prev;

            entry->prev = NULL;
            entry->next = NULL;
            return entry;
        }
        entry = entry->next;
    }
    return NULL;
}